

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

int luaS_eqlngstr(TString *a,TString *b)

{
  int iVar1;
  bool local_22;
  bool local_21;
  size_t len;
  TString *b_local;
  TString *a_local;
  
  if ((a->tt == '\x14') && (b->tt == '\x14')) {
    local_21 = true;
    if (a != b) {
      local_22 = false;
      if ((a->u).lnglen == (b->u).lnglen) {
        iVar1 = memcmp(a + 1,b + 1,(a->u).lnglen);
        local_22 = iVar1 == 0;
      }
      local_21 = local_22;
    }
    return (int)local_21;
  }
  __assert_fail("a->tt == ((4) | ((1) << 4)) && b->tt == ((4) | ((1) << 4))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstring.c"
                ,0x2a,"int luaS_eqlngstr(TString *, TString *)");
}

Assistant:

int luaS_eqlngstr (TString *a, TString *b) {
  size_t len = a->u.lnglen;
  lua_assert(a->tt == LUA_TLNGSTR && b->tt == LUA_TLNGSTR);
  return (a == b) ||  /* same instance or... */
    ((len == b->u.lnglen) &&  /* equal length and ... */
     (memcmp(getstr(a), getstr(b), len) == 0));  /* equal contents */
}